

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gfp.c
# Opt level: O0

bool_t gfpCreate(qr_o *r,octet *p,size_t no,void *stack)

{
  void *in_RCX;
  size_t in_RDX;
  byte *in_RSI;
  qr_o *in_RDI;
  undefined4 local_4;
  
  if (((in_RDX == 0) || ((uint)*in_RSI % 2 == 0)) || ((in_RDX == 1 && (*in_RSI == 1)))) {
    local_4 = 0;
  }
  else {
    zmCreate(in_RDI,in_RSI,in_RDX,in_RCX);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

bool_t gfpCreate(qr_o* r, const octet p[], size_t no, void* stack)
{
	ASSERT(memIsValid(r, sizeof(*r)));
	ASSERT(memIsValid(p, no));
	ASSERT(no > 0 && p[no - 1] > 0);
	// p -- четное или p == 1?
	if (no == 0 || p[0] % 2 == 0 || no == 1 && p[0] == 1)
		return FALSE;
	// создать GF(p) как ZZ / (p)
	zmCreate(r, p, no, stack);
	return TRUE;
}